

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

void __thiscall CCoinsViewCache::ReallocateCache(CCoinsViewCache *this)

{
  CCoinsMapMemoryResource *this_00;
  long in_FS_OFFSET;
  allocator_type local_40;
  key_equal local_31;
  SaltedOutpointHasher local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->cacheCoins)._M_h._M_element_count != 0) {
    __assert_fail("cacheCoins.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/coins.cpp"
                  ,0x138,"void CCoinsViewCache::ReallocateCache()");
  }
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->cacheCoins)._M_h);
  this_00 = &this->m_cache_coins_memory_resource;
  PoolResource<144UL,_8UL>::~PoolResource(this_00);
  PoolResource<144UL,_8UL>::PoolResource(this_00);
  SaltedOutpointHasher::SaltedOutpointHasher(&local_30,this->m_deterministic);
  local_40.m_resource = this_00;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->cacheCoins)._M_h,0,&local_30,&local_31,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCoinsViewCache::ReallocateCache()
{
    // Cache should be empty when we're calling this.
    assert(cacheCoins.size() == 0);
    cacheCoins.~CCoinsMap();
    m_cache_coins_memory_resource.~CCoinsMapMemoryResource();
    ::new (&m_cache_coins_memory_resource) CCoinsMapMemoryResource{};
    ::new (&cacheCoins) CCoinsMap{0, SaltedOutpointHasher{/*deterministic=*/m_deterministic}, CCoinsMap::key_equal{}, &m_cache_coins_memory_resource};
}